

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

void __thiscall
btCollisionWorldImporter::btCollisionWorldImporter
          (btCollisionWorldImporter *this,btCollisionWorld *world)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  btAlignedObjectArray<btCollisionObject_*> *in_stack_ffffffffffffff40;
  btHashMap<btHashPtr,_btOptimizedBvh_*> *in_stack_ffffffffffffff60;
  btHashMap<btHashString,_btCollisionObject_*> *this_00;
  
  *in_RDI = &PTR__btCollisionWorldImporter_002e2d68;
  in_RDI[1] = in_RSI;
  *(undefined4 *)(in_RDI + 2) = 0;
  btAlignedObjectArray<btCollisionShape_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionShape_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btCollisionObject_*>::btAlignedObjectArray(in_stack_ffffffffffffff40);
  btAlignedObjectArray<btOptimizedBvh_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btOptimizedBvh_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btTriangleInfoMap_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btTriangleInfoMap_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btTriangleIndexVertexArray_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btCollisionObject_*>::btAlignedObjectArray(in_stack_ffffffffffffff40);
  btAlignedObjectArray<char_*>::btAlignedObjectArray
            ((btAlignedObjectArray<char_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<int_*>::btAlignedObjectArray
            ((btAlignedObjectArray<int_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<short_*>::btAlignedObjectArray
            ((btAlignedObjectArray<short_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<unsigned_char_*>::btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_char_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btVector3FloatData_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3FloatData_*> *)in_stack_ffffffffffffff40);
  btAlignedObjectArray<btVector3DoubleData_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3DoubleData_*> *)in_stack_ffffffffffffff40);
  btHashMap<btHashPtr,_btOptimizedBvh_*>::btHashMap(in_stack_ffffffffffffff60);
  this_00 = (btHashMap<btHashString,_btCollisionObject_*> *)(in_RDI + 0x47);
  btHashMap<btHashPtr,_btTriangleInfoMap_*>::btHashMap
            ((btHashMap<btHashPtr,_btTriangleInfoMap_*> *)this_00);
  btHashMap<btHashString,_btCollisionShape_*>::btHashMap
            ((btHashMap<btHashString,_btCollisionShape_*> *)this_00);
  btHashMap<btHashString,_btCollisionObject_*>::btHashMap(this_00);
  btHashMap<btHashPtr,_const_char_*>::btHashMap((btHashMap<btHashPtr,_const_char_*> *)this_00);
  btHashMap<btHashPtr,_btCollisionShape_*>::btHashMap
            ((btHashMap<btHashPtr,_btCollisionShape_*> *)this_00);
  btHashMap<btHashPtr,_btCollisionObject_*>::btHashMap
            ((btHashMap<btHashPtr,_btCollisionObject_*> *)this_00);
  return;
}

Assistant:

btCollisionWorldImporter::btCollisionWorldImporter(btCollisionWorld* world)
:m_collisionWorld(world),
m_verboseMode(0)
{

}